

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

void __thiscall minja::LiteralExpr::LiteralExpr(LiteralExpr *this,Location *loc,Value *v)

{
  Expression::Expression(&this->super_Expression,loc);
  (this->super_Expression)._vptr_Expression = (_func_int **)&PTR_do_evaluate_0022cad0;
  Value::Value(&this->value,v);
  return;
}

Assistant:

LiteralExpr(const Location & loc, const Value& v)
      : Expression(loc), value(v) {}